

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O2

void ihevc_intra_pred_luma_dc
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  long lVar6;
  UWORD8 *pUVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar2 = nt << 0x1e | nt - 4U >> 2;
  if (uVar2 < 4) {
    bVar1 = (byte)*(undefined4 *)(&DAT_0017766c + (ulong)uVar2 * 4);
  }
  else {
    bVar1 = 6;
  }
  lVar6 = (long)nt;
  uVar8 = lVar6 * 2;
  iVar4 = 0;
  for (lVar9 = lVar6; SBORROW8(lVar9,uVar8) != lVar9 + lVar6 * -2 < 0; lVar9 = lVar9 + 1) {
    iVar4 = iVar4 + (uint)pu1_ref[lVar9];
  }
  for (uVar10 = uVar8 | 1; (long)uVar10 <= (long)(nt * 3); uVar10 = uVar10 + 1) {
    iVar4 = iVar4 + (uint)pu1_ref[uVar10];
  }
  iVar4 = iVar4 + nt >> (bVar1 & 0x1f);
  if (nt == 0x20) {
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
      for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 1) {
        pu1_dst[lVar6] = (UWORD8)iVar4;
      }
      pu1_dst = pu1_dst + dst_strd;
    }
  }
  else {
    *pu1_dst = (UWORD8)((uint)pu1_ref[(long)(int)uVar8 + 1] + (uint)pu1_ref[uVar8 - 1] + iVar4 * 2 +
                        2 >> 2);
    iVar3 = iVar4 * 3 + 2;
    for (lVar9 = 1; lVar9 < lVar6; lVar9 = lVar9 + 1) {
      pu1_dst[lVar9] = (UWORD8)((uint)pu1_ref[lVar9 + uVar8 + 1] + iVar3 >> 2);
    }
    pbVar5 = pu1_ref + ((int)uVar8 + -2);
    pUVar7 = pu1_dst + dst_strd;
    for (lVar9 = 1; lVar9 < lVar6; lVar9 = lVar9 + 1) {
      *pUVar7 = (UWORD8)((uint)*pbVar5 + iVar3 >> 2);
      pbVar5 = pbVar5 + -1;
      pUVar7 = pUVar7 + dst_strd;
    }
    pUVar7 = pu1_dst + dst_strd;
    for (lVar9 = 1; lVar9 < lVar6; lVar9 = lVar9 + 1) {
      for (uVar8 = 1; (uint)nt != uVar8; uVar8 = uVar8 + 1) {
        pUVar7[uVar8] = (UWORD8)iVar4;
      }
      pUVar7 = pUVar7 + dst_strd;
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_dc(UWORD8 *pu1_ref,
                              WORD32 src_strd,
                              UWORD8 *pu1_dst,
                              WORD32 dst_strd,
                              WORD32 nt,
                              WORD32 mode)
{

    WORD32 acc_dc;
    WORD32 dc_val, two_dc_val, three_dc_val;
    WORD32 i;
    WORD32 row, col;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;
    UNUSED(mode);
    UNUSED(src_strd);
    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;

    acc_dc = 0;
    /* Calculate DC value for the transform block */
    for(i = nt; i < two_nt; i++)
        acc_dc += pu1_ref[i];

    for(i = (two_nt + 1); i <= three_nt; i++)
        acc_dc += pu1_ref[i];

    dc_val = (acc_dc + nt) >> (log2nt + 1);

    two_dc_val = 2 * dc_val;
    three_dc_val = 3 * dc_val;


    if(nt == 32)
    {
        for(row = 0; row < nt; row++)
            for(col = 0; col < nt; col++)
                pu1_dst[(row * dst_strd) + col] = dc_val;
    }
    else
    {
        /* DC filtering for the first top row and first left column */
        pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                        >> 2);

        for(col = 1; col < nt; col++)
            pu1_dst[col] = (pu1_ref[two_nt + 1 + col] + three_dc_val + 2) >> 2;

        for(row = 1; row < nt; row++)
            pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                            >> 2;

        /* Fill the remaining rows with DC value*/
        for(row = 1; row < nt; row++)
            for(col = 1; col < nt; col++)
                pu1_dst[(row * dst_strd) + col] = dc_val;
    }
}